

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void unload_data_entries(DATA_ENTRY *data)

{
  int iVar1;
  long in_RDI;
  bool bVar2;
  long local_8;
  
  local_8 = in_RDI;
  while( true ) {
    bVar2 = false;
    if (local_8 != 0) {
      bVar2 = *(long *)(local_8 + 0x38) != 0;
    }
    if (!bVar2) break;
    iVar1 = strcmp(*(char **)(local_8 + 8),"bitmap");
    if (iVar1 == 0) {
      al_destroy_bitmap(*(undefined8 *)(local_8 + 0x38));
    }
    iVar1 = strcmp(*(char **)(local_8 + 8),"font");
    if (iVar1 == 0) {
      al_destroy_font(*(undefined8 *)(local_8 + 0x38));
    }
    iVar1 = strcmp(*(char **)(local_8 + 8),"sample");
    if (iVar1 == 0) {
      al_destroy_sample(*(undefined8 *)(local_8 + 0x38));
    }
    iVar1 = strcmp(*(char **)(local_8 + 8),"music");
    if (iVar1 == 0) {
      al_destroy_audio_stream(*(undefined8 *)(local_8 + 0x38));
    }
    local_8 = local_8 + 0x40;
  }
  return;
}

Assistant:

void unload_data_entries(DATA_ENTRY *data)
{
    while (data && data->dat) {
        if (!strcmp(data->type, "bitmap")) al_destroy_bitmap(data->dat);
        if (!strcmp(data->type, "font")) al_destroy_font(data->dat);
        if (!strcmp(data->type, "sample")) al_destroy_sample(data->dat);
        if (!strcmp(data->type, "music")) al_destroy_audio_stream(data->dat);
        data++;
    }
}